

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O2

void Map_Destroy(Map *tree)

{
  void *data;
  long lVar1;
  size_t sVar2;
  void *pvVar3;
  long lVar4;
  Stack nodes;
  Stack path;
  Stack local_40;
  Stack local_30;
  
  Stack_Init(&local_30);
  Stack_Init(&local_40);
  Stack_Push(&local_30,tree);
  Stack_Push(&local_40,tree);
  while (local_30.size != 0) {
    pvVar3 = Stack_Pop(&local_30);
    *(long *)((long)pvVar3 + 0x808) = (long)pvVar3 + 0x808;
    for (lVar4 = 0; lVar4 != 0x100; lVar4 = lVar4 + 1) {
      data = *(void **)((long)pvVar3 + lVar4 * 8 + 8);
      if ((data != (void *)0x0) && (*(long *)((long)data + 0x808) != (long)data + 0x808)) {
        Stack_Push(&local_30,data);
        lVar1 = *(long *)((long)pvVar3 + lVar4 * 8 + 8);
        *(long *)(lVar1 + 0x808) = lVar1 + 0x808;
        Stack_Push(&local_40,*(void **)((long)pvVar3 + lVar4 * 8 + 8));
      }
    }
  }
  while( true ) {
    sVar2 = local_40.size;
    pvVar3 = Stack_Pop(&local_40);
    if (sVar2 < 2) break;
    free(pvVar3);
  }
  return;
}

Assistant:

void Map_Destroy(Map *tree)
{
	Stack path;
	Stack nodes;
	Map *current_node;
	unsigned int i;
	 

	Stack_Init(&path);
	Stack_Init(&nodes);

	Stack_Push(&path,tree);
	Stack_Push(&nodes,tree);

	/*
	   using DFS we fill up the nodes stack with all the used
	   (accessible) nodes.
	 */
	while(path.size>0)
	{
		current_node=Stack_Pop(&path);
		current_node->ID=&(current_node->ID);/*mark the node*/
		for(i=0;i<256;++i)
		{
			if(current_node->delta[i]!=NULL && current_node->delta[i]->ID != &(current_node->delta[i]->ID) )
			{
				Stack_Push(&path,current_node->delta[i]);


				/*we mark the unmarked child of the current_node*/
				current_node->delta[i]->ID=&(current_node->delta[i]->ID);
				/*every node in nodes continues to be marked*/
				Stack_Push(&nodes,current_node->delta[i]);
			}
		}
		
	}
	/*
	   There should not be any duplicates in here
	 */
	while(nodes.size>1)
	{
		current_node=Stack_Pop(&nodes);
		/*Again the things that ID points to is not freed ( this structure is used to map the structure of data )
		  deletion of it is up to you.
		 */
		free(current_node);
	}
	/*this is where the root is at- we don't delete it , but we must free the last stack node*/
	Stack_Pop(&nodes);


}